

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

bool __thiscall PDA::isEndState(PDA *this,State *state)

{
  bool bVar1;
  __type _Var2;
  reference ppSVar3;
  string *__lhs;
  string *__rhs;
  State *endState;
  iterator __end1;
  iterator __begin1;
  vector<State_*,_std::allocator<State_*>_> *__range1;
  State *state_local;
  PDA *this_local;
  
  __end1 = std::vector<State_*,_std::allocator<State_*>_>::begin(&this->endStatesF);
  endState = (State *)std::vector<State_*,_std::allocator<State_*>_>::end(&this->endStatesF);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>
                                *)&endState);
    if (!bVar1) {
      return false;
    }
    ppSVar3 = __gnu_cxx::
              __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
              operator*(&__end1);
    __lhs = State::getName_abi_cxx11_(*ppSVar3);
    __rhs = State::getName_abi_cxx11_(state);
    _Var2 = std::operator==(__lhs,__rhs);
    if (_Var2) break;
    __gnu_cxx::__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
    operator++(&__end1);
  }
  return true;
}

Assistant:

bool PDA::isEndState(State *state) {
    for (State *endState: endStatesF) {
        if (endState->getName() == state->getName()) {
            return true;
        }
    }
    return false;
}